

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::FunctionBody::GetLineCharOffsetFromStartChar
          (FunctionBody *this,int startCharOfStatement,ULONG *_line,LONG *_charOffset,
          bool canAllocateLineCache)

{
  Utf8SourceInfo *this_00;
  SRCINFO *pSVar1;
  SourceContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  HRESULT HVar5;
  undefined4 *puVar6;
  ULONG UVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  ulong uVar9;
  charcount_t local_4c;
  charcount_t *pcStack_48;
  charcount_t cacheLine;
  charcount_t local_3c;
  charcount_t local_38;
  charcount_t lineByteOffset;
  charcount_t column;
  
  uVar8 = CONCAT71(in_register_00000081,canAllocateLineCache);
  if (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8 &
       4) != 0) && (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x44 & 8) == 0))
  {
    lineByteOffset = (charcount_t)uVar8;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc95,
                                "(!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode())"
                                ,
                                "!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode()"
                               );
    if (!bVar4) goto LAB_0076ee60;
    *puVar6 = 0;
    uVar8 = (ulong)lineByteOffset;
  }
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  pSVar1 = (this_00->m_srcInfo).ptr;
  UVar7 = pSVar1->dlnHost - pSVar1->lnMinHost;
  local_38 = 0;
  local_3c = 0;
  if (startCharOfStatement < 1) goto LAB_0076ed77;
  uVar9 = uVar8 ^ 1;
  if ((char)uVar8 == '\x01') {
    lineByteOffset = (charcount_t)uVar9;
    HVar5 = Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(this_00);
    bVar4 = true;
    if (HVar5 < 0) {
      if (HVar5 == -0x7fffbffc) {
        bVar4 = false;
        goto LAB_0076ed30;
      }
      if (HVar5 != -0x7ff8fff2) {
        AssertCount = AssertCount + 1;
        pcStack_48 = (charcount_t *)_charOffset;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xca7,"(hr == ((HRESULT)0x80004004L))","hr == E_ABORT");
        if (!bVar4) {
LAB_0076ee60:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        bVar4 = false;
        _charOffset = (LONG *)pcStack_48;
        goto LAB_0076ed30;
      }
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
      m_lineOffsetCache).ptr = (LineOffsetCache *)0x0;
      uVar9 = 1;
      bVar4 = true;
    }
    else {
LAB_0076ed30:
      uVar9 = (ulong)lineByteOffset;
    }
    if (bVar4) goto LAB_0076ed38;
    bVar4 = false;
  }
  else {
LAB_0076ed38:
    local_4c = 0;
    Utf8SourceInfo::GetLineInfoForCharPosition
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
               startCharOfStatement,&local_4c,&local_38,&local_3c,SUB81(uVar9,0));
    UVar7 = UVar7 + local_4c;
    bVar4 = true;
  }
  if (!bVar4) {
    return false;
  }
LAB_0076ed77:
  pSVar1 = (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
           m_srcInfo).ptr;
  pSVar2 = (pSVar1->sourceContextInfo).ptr;
  if ((pSVar2->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar2->isHostDynamicDocument & 1U) != 0)) {
    UVar7 = UVar7 + (int)((char)((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47
                                << 6) >> 7);
  }
  if (_line != (ULONG *)0x0) {
    *_line = UVar7;
  }
  if (((charcount_t *)_charOffset != (charcount_t *)0x0) &&
     (*_charOffset = local_38, pSVar1->dlnHost == UVar7)) {
    *_charOffset = local_38 + pSVar1->ulColumnHost;
  }
  return true;
}

Assistant:

bool FunctionBody::GetLineCharOffsetFromStartChar(int startCharOfStatement, ULONG* _line, LONG* _charOffset, bool canAllocateLineCache /*= true*/)
    {
        Assert(!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode());

        // The following adjusts for where the script is within the document
        ULONG line = this->GetHostStartLine();
        charcount_t column = 0;
        ULONG lineCharOffset = 0;
        charcount_t lineByteOffset = 0;

        if (startCharOfStatement > 0)
        {
            bool doSlowLookup = !canAllocateLineCache;
            if (canAllocateLineCache)
            {
                HRESULT hr = this->GetUtf8SourceInfo()->EnsureLineOffsetCacheNoThrow();
                if (FAILED(hr))
                {
                    if (hr != E_OUTOFMEMORY)
                    {
                        Assert(hr == E_ABORT); // The only other possible error we know about is ScriptAbort from QueryContinue.
                        return false;
                    }

                    // Clear the cache so it is not used.
                    this->GetUtf8SourceInfo()->DeleteLineOffsetCache();

                    // We can try and do the slow lookup below
                    doSlowLookup = true;
                }
            }

            charcount_t cacheLine = 0;
            this->GetUtf8SourceInfo()->GetLineInfoForCharPosition(startCharOfStatement, &cacheLine, &column, &lineByteOffset, doSlowLookup);

            // Update the tracking variables to jump to the line position (only need to jump if not on the first line).
            if (cacheLine > 0)
            {
                line += cacheLine;
                lineCharOffset = startCharOfStatement - column;
            }
        }

        if (this->GetSourceContextInfo()->IsDynamic() && this->m_isDynamicFunction)
        {
            line -= JavascriptFunction::numberLinesPrependedToAnonymousFunction;
        }

        if(_line)
        {
            *_line = line;
        }

        if(_charOffset)
        {
            *_charOffset = column;

            // If we are at the beginning of the host code, adjust the offset based on the host provided offset
            if (this->GetHostSrcInfo()->dlnHost == line)
            {
                *_charOffset += (LONG)this->GetHostStartColumn();
            }
        }

        return true;
    }